

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1823:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1823:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *output_00;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> depResult;
  Exception local_5c8;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> local_468;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> local_2f0;
  Exception local_178;
  
  output_00 = &local_468;
  local_468.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_468.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&output_00->super_ExceptionOrValue);
  if (local_468.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_178,&local_468.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_5c8.ownFile.content.ptr = local_178.ownFile.content.ptr;
    local_5c8.ownFile.content.size_ = local_178.ownFile.content.size_;
    local_5c8.ownFile.content.disposer = local_178.ownFile.content.disposer;
    local_178.ownFile.content.ptr = (char *)0x0;
    local_178.ownFile.content.size_ = 0;
    local_5c8.file = local_178.file;
    local_5c8.line = local_178.line;
    local_5c8.type = local_178.type;
    local_5c8.description.content.ptr = local_178.description.content.ptr;
    local_5c8.description.content.size_ = local_178.description.content.size_;
    local_178.description.content.ptr = (char *)0x0;
    local_178.description.content.size_ = 0;
    local_5c8.description.content.disposer = local_178.description.content.disposer;
    local_5c8.context.ptr.disposer = local_178.context.ptr.disposer;
    local_5c8.context.ptr.ptr = local_178.context.ptr.ptr;
    local_178.context.ptr.ptr = (Context *)0x0;
    memcpy(local_5c8.trace,local_178.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_2f0,&local_5c8);
    local_2f0.value.ptr.isSet = false;
    Exception::~Exception(&local_5c8);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> *)output,&local_2f0);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::~ExceptionOr(&local_2f0);
    Exception::~Exception(&local_178);
  }
  else if (local_468.value.ptr.isSet == true) {
    anon_class_1_0_00000001_for_func::operator()
              ((anon_class_1_0_00000001_for_func *)&local_5c8,
               (Maybe<kj::Own<kj::AsyncCapabilityStream>_> *)output_00);
    local_2f0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_2f0.value.ptr.isSet = true;
    local_2f0.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_5c8.ownFile.content.ptr;
    local_2f0.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_5c8.ownFile.content.size_;
    local_5c8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_> *)output,&local_2f0);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>_>::~ExceptionOr(&local_2f0);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_5c8);
  }
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>::~ExceptionOr(&local_468);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }